

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

U64 ZSTD_ldm_ipow(U64 base,U64 exp)

{
  U64 ret;
  U64 exp_local;
  U64 base_local;
  
  ret = 1;
  base_local = base;
  for (exp_local = exp; exp_local != 0; exp_local = exp_local >> 1) {
    if ((exp_local & 1) != 0) {
      ret = base_local * ret;
    }
    base_local = base_local * base_local;
  }
  return ret;
}

Assistant:

static U64 ZSTD_ldm_ipow(U64 base, U64 exp)
{
    U64 ret = 1;
    while (exp) {
        if (exp & 1) { ret *= base; }
        exp >>= 1;
        base *= base;
    }
    return ret;
}